

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

ParseResult * __thiscall
cxxopts::OptionParser::parse
          (ParseResult *__return_storage_ptr__,OptionParser *this,int argc,char **argv)

{
  ParsedHashMap *pPVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Hash_node_base *p_Var4;
  key_type *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  bool bVar6;
  _Alloc_hider _Var7;
  ParseResult *pPVar8;
  char cVar9;
  int iVar10;
  const_iterator cVar11;
  long *plVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  size_type *psVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  char *pcVar17;
  pointer __k_00;
  _Hash_node_base *p_Var18;
  shared_ptr<cxxopts::OptionDetails> *psVar19;
  int current;
  bool matched;
  string arg_value;
  string name;
  shared_ptr<cxxopts::OptionDetails> value;
  size_t hash_2;
  ArguDesc argu_desc;
  size_t hash;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unmatched;
  ParseResult *parsed;
  int local_154;
  bool local_14d;
  int local_14c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  char **local_128;
  string local_120;
  shared_ptr<cxxopts::OptionDetails> local_100;
  shared_ptr<const_cxxopts::OptionDetails> local_f0;
  undefined1 local_e0 [24];
  undefined1 local_c8 [16];
  undefined1 local_b8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  size_t local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  ParseResult *local_50;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_48;
  
  local_154 = 1;
  __k_00 = (this->m_positional->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_68._M_allocated_capacity = 0;
  local_68._8_8_ = 0;
  local_58 = 0;
  local_e0._20_4_ = (undefined4)CONCAT71((int7)((ulong)this->m_positional >> 8),1);
  local_14c = argc;
  local_128 = argv;
  local_50 = __return_storage_ptr__;
  if (argc != 1) {
    pPVar1 = &this->m_parsed;
    local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->m_sequential;
    do {
      pcVar17 = local_128[local_154];
      if (((*pcVar17 == '-') && (pcVar17[1] == '-')) && (pcVar17[2] == '\0')) {
        local_154 = local_154 + 1;
        local_e0._20_4_ = 0;
        break;
      }
      local_14d = false;
      values::parser_tool::ParseArgument((ArguDesc *)local_c8,pcVar17,&local_14d);
      if (local_14d == false) {
        pcVar17 = local_128[local_154];
        if (((*pcVar17 == '-') && (pcVar17[1] != '\0')) && (this->m_allow_unrecognised == false)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,pcVar17,(allocator<char> *)&local_148);
          throw_or_mimic<cxxopts::option_syntax_exception>(&local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          pcVar17 = local_128[local_154];
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,pcVar17,(allocator<char> *)&local_f0);
        while (__k_00 != (this->m_positional->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish) {
          cVar11 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&this->m_options->_M_h,__k_00);
          if (cVar11.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            throw_or_mimic<cxxopts::option_not_exists_exception>(__k_00);
          }
          else {
            cVar9 = (**(code **)(**(long **)(*(long *)((long)cVar11.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                                  ._M_cur + 0x28) + 0x60) + 0x30))();
            psVar19 = (shared_ptr<cxxopts::OptionDetails> *)
                      ((long)cVar11.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                             ._M_cur + 0x28);
            if (cVar9 != '\0') {
              bVar6 = true;
              parse_option(this,psVar19,__k_00,&local_120);
              goto LAB_00110305;
            }
            local_148._M_dataplus._M_p =
                 (pointer)((psVar19->
                           super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->m_hash;
            pmVar13 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)pPVar1,(key_type *)&local_148);
            if (pmVar13->m_count == 0) {
              parse_option(this,psVar19,__k_00,&local_120);
              __k_00 = __k_00 + 1;
              bVar6 = true;
              goto LAB_00110305;
            }
            __k_00 = __k_00 + 1;
          }
        }
        bVar6 = false;
LAB_00110305:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if (!bVar6) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     local_68._M_local_buf,local_128 + local_154);
        }
      }
      else if ((bool)local_b8[0x10] == true) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          do {
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_120,'\x01');
            cVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&this->m_options->_M_h,&local_120);
            if (cVar11.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              if (this->m_allow_unrecognised != true) {
                throw_or_mimic<cxxopts::option_not_exists_exception>(&local_120);
                goto LAB_0010fe8c;
              }
              local_f0.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)local_e0;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"-","");
              plVar12 = (long *)std::__cxx11::string::_M_replace_aux
                                          ((ulong)&local_f0,
                                           (ulong)local_f0.
                                                  super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi,0,'\x01');
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              psVar15 = (size_type *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_148.field_2._M_allocated_capacity = *psVar15;
                local_148.field_2._8_8_ = plVar12[3];
              }
              else {
                local_148.field_2._M_allocated_capacity = *psVar15;
                local_148._M_dataplus._M_p = (pointer)*plVar12;
              }
              local_148._M_string_length = plVar12[1];
              *plVar12 = (long)psVar15;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_68._M_local_buf,&local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
              if (local_f0.
                  super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)local_e0) {
                operator_delete(local_f0.
                                super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,(ulong)(local_e0._0_8_ + 1));
              }
              iVar10 = 6;
            }
            else {
LAB_0010fe8c:
              local_100.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = *(element_type **)
                        ((long)cVar11.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                               ._M_cur + 0x28);
              local_100.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    ((long)cVar11.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                           ._M_cur + 0x30);
              if (local_100.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_100.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_100.
                        super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_100.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_100.
                        super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&p_Var16->_vptr__Sp_counted_base + 1);
              if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_) {
                checked_parse_arg(this,local_14c,local_128,&local_154,&local_100,&local_120);
LAB_001100de:
                iVar10 = 0;
              }
              else {
                iVar10 = (*(((local_100.
                              super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_value).
                            super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->_vptr_Value[7])();
                if ((char)iVar10 != '\0') {
                  (*(((local_100.
                       super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->m_value).
                     super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_Value[9])(&local_148);
                  local_70 = (local_100.
                              super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_hash;
                  pmVar13 = std::__detail::
                            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)pPVar1,&local_70);
                  local_f0.
                  super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = local_100.
                           super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  local_f0.
                  super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       local_100.
                       super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
                  if (local_100.
                      super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_100.
                       super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_100.
                            super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_100.
                       super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_100.
                            super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  OptionValue::ensure_value(pmVar13,&local_f0);
                  pmVar13->m_count = pmVar13->m_count + 1;
                  peVar3 = (pmVar13->m_value).
                           super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  (*peVar3->_vptr_Value[3])(peVar3,&local_148);
                  pmVar13->m_long_name =
                       &(local_f0.
                         super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_long;
                  if (local_f0.
                      super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_f0.
                               super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                  std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
                  emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                            ((vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *)
                             local_78._M_pi,
                             &(local_100.
                               super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_long,&local_148);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_148._M_dataplus._M_p != &local_148.field_2) {
                    operator_delete(local_148._M_dataplus._M_p,
                                    local_148.field_2._M_allocated_capacity + 1);
                  }
                  goto LAB_001100de;
                }
                if ((ulong)local_c8._8_8_ <= p_Var2) {
                  throw_or_mimic<cxxopts::option_requires_argument_exception>(&local_120);
                  goto LAB_001100de;
                }
                std::__cxx11::string::substr((ulong)&local_148,(ulong)local_c8);
                local_70 = (local_100.
                            super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_hash;
                pmVar13 = std::__detail::
                          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)pPVar1,&local_70);
                local_f0.
                super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = local_100.
                       super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                ;
                local_f0.
                super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     local_100.
                     super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
                if (local_100.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_100.
                     super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_100.
                          super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_100.
                     super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_100.
                          super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                OptionValue::ensure_value(pmVar13,&local_f0);
                pmVar13->m_count = pmVar13->m_count + 1;
                peVar3 = (pmVar13->m_value).
                         super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                (*peVar3->_vptr_Value[3])(peVar3,&local_148);
                pmVar13->m_long_name =
                     &(local_f0.
                       super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_long;
                if (local_f0.
                    super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_f0.
                             super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
                emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                          ((vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *)
                           local_78._M_pi,
                           &(local_100.
                             super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->m_long,&local_148);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p != &local_148.field_2) {
                  operator_delete(local_148._M_dataplus._M_p,
                                  local_148.field_2._M_allocated_capacity + 1);
                }
                iVar10 = 4;
              }
              if (local_100.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_100.
                           super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
          } while (((iVar10 == 6) || (iVar10 == 0)) &&
                  (p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             ((long)&p_Var16->_vptr__Sp_counted_base + 1),
                  p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_));
        }
      }
      else if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        cVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this->m_options->_M_h,(key_type *)local_c8);
        if (cVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (this->m_allow_unrecognised == true) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_68._M_local_buf,local_128 + local_154);
            goto LAB_00110470;
          }
          throw_or_mimic<cxxopts::option_not_exists_exception>((string *)local_c8);
        }
        local_148._M_dataplus._M_p =
             *(pointer *)
              ((long)cVar11.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                     ._M_cur + 0x28);
        local_148._M_string_length =
             *(long *)((long)cVar11.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                             ._M_cur + 0x30);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_148._M_string_length)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_148._M_string_length)->_M_use_count + 1;
          }
        }
        if ((bool)local_b8[0x11] == true) {
          local_f0.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = *(element_type **)(local_148._M_dataplus._M_p + 0x78);
          pmVar13 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)pPVar1,(key_type *)&local_f0);
          local_120._M_dataplus._M_p = local_148._M_dataplus._M_p;
          local_120._M_string_length = local_148._M_string_length;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_148._M_string_length + 8) =
                   *(_Atomic_word *)(local_148._M_string_length + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_148._M_string_length + 8) =
                   *(_Atomic_word *)(local_148._M_string_length + 8) + 1;
            }
          }
          OptionValue::ensure_value(pmVar13,(shared_ptr<const_cxxopts::OptionDetails> *)&local_120);
          pmVar13->m_count = pmVar13->m_count + 1;
          peVar3 = (pmVar13->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar3->_vptr_Value[3])(peVar3,&local_a0);
          pmVar13->m_long_name = (string *)(local_120._M_dataplus._M_p + 0x20);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_string_length);
          }
          std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
          emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *)local_78._M_pi,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_148._M_dataplus._M_p + 0x20),&local_a0);
        }
        else {
          checked_parse_arg(this,local_14c,local_128,&local_154,
                            (shared_ptr<cxxopts::OptionDetails> *)&local_148,(string *)local_c8);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length);
        }
      }
LAB_00110470:
      local_154 = local_154 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((_Hash_node_base *)local_c8._0_8_ != (_Hash_node_base *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._0_8_ + 1));
      }
    } while (local_154 != local_14c);
  }
  p_Var18 = (this->m_options->_M_h)._M_before_begin._M_nxt;
  if (p_Var18 != (_Hash_node_base *)0x0) {
    pPVar1 = &this->m_parsed;
    do {
      p_Var4 = p_Var18[5]._M_nxt[0xc]._M_nxt;
      local_c8._0_8_ = p_Var18[5]._M_nxt[0xf]._M_nxt;
      pmVar13 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)pPVar1,(key_type *)local_c8);
      cVar9 = (*(code *)p_Var4->_M_nxt[5]._M_nxt)(p_Var4);
      if (cVar9 == '\0') {
        local_c8._0_8_ = p_Var18[5]._M_nxt[0xf]._M_nxt;
        pmVar13 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)pPVar1,(key_type *)local_c8);
        p_Var4 = p_Var18[5]._M_nxt;
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var18[6]._M_nxt;
        if (p_Var16 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pmVar13->m_long_name = (string *)(p_Var4 + 4);
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
          pmVar13->m_long_name = (string *)(p_Var4 + 4);
LAB_001105e1:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
      }
      else if ((pmVar13->m_count == 0) && (pmVar13->m_default == false)) {
        local_c8._0_8_ = p_Var18[5]._M_nxt[0xf]._M_nxt;
        pmVar13 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)pPVar1,(key_type *)local_c8);
        local_c8._0_8_ = p_Var18[5]._M_nxt;
        local_c8._8_8_ = p_Var18[6]._M_nxt;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_)->_M_use_count + 1;
          }
        }
        OptionValue::ensure_value(pmVar13,(shared_ptr<const_cxxopts::OptionDetails> *)local_c8);
        pmVar13->m_default = true;
        pmVar13->m_long_name = (string *)(local_c8._0_8_ + 0x20);
        (*((pmVar13->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_vptr_Value[4])();
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001105e1;
      }
      p_Var18 = p_Var18->_M_nxt;
    } while (p_Var18 != (_Hash_node_base *)0x0);
  }
  if (local_e0[0x14] == '\0') {
    if (local_154 < local_14c) {
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_c8,local_128[local_154],(allocator<char> *)&local_148);
        if (__k_00 == (this->m_positional->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          bVar6 = false;
        }
        else {
          do {
            cVar11 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&this->m_options->_M_h,__k_00);
            if (cVar11.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              throw_or_mimic<cxxopts::option_not_exists_exception>(__k_00);
            }
            else {
              cVar9 = (**(code **)(**(long **)(*(long *)((long)cVar11.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                                  ._M_cur + 0x28) + 0x60) + 0x30))();
              psVar19 = (shared_ptr<cxxopts::OptionDetails> *)
                        ((long)cVar11.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                               ._M_cur + 0x28);
              if (cVar9 != '\0') {
                bVar6 = true;
                parse_option(this,psVar19,__k_00,(string *)local_c8);
                goto LAB_00110734;
              }
              local_120._M_dataplus._M_p =
                   (pointer)((psVar19->
                             super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>)
                            ._M_ptr)->m_hash;
              pmVar13 = std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&this->m_parsed,(key_type *)&local_120);
              if (pmVar13->m_count == 0) {
                parse_option(this,psVar19,__k_00,(string *)local_c8);
                __k_00 = __k_00 + 1;
                bVar6 = true;
                goto LAB_00110734;
              }
              __k_00 = __k_00 + 1;
            }
          } while (__k_00 != (this->m_positional->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
          bVar6 = false;
        }
LAB_00110734:
        if ((_Hash_node_base *)local_c8._0_8_ != (_Hash_node_base *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._0_8_ + 1));
        }
      } while ((bVar6) && (local_154 = local_154 + 1, local_154 < local_14c));
    }
    if (local_154 != local_14c) {
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   local_68._M_local_buf,local_128 + local_154);
        local_154 = local_154 + 1;
      } while (local_154 != local_14c);
    }
  }
  p_Var18 = (this->m_options->_M_h)._M_before_begin._M_nxt;
  if (p_Var18 != (_Hash_node_base *)0x0) {
    do {
      __k = (key_type *)p_Var18[5]._M_nxt;
      paVar5 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)((long)&__k[3].field_2 + 8);
      local_120._M_dataplus._M_p = (pointer)paVar5;
      pmVar14 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_keys,__k);
      _Var7._M_p = local_120._M_dataplus._M_p;
      *pmVar14 = (mapped_type)paVar5;
      pmVar14 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_keys,__k + 1);
      *pmVar14 = (mapped_type)_Var7._M_p;
      local_b8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b8._8_8_ = 0;
      local_c8._0_8_ = (_Hash_node_base *)0x0;
      local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b8._16_8_ = 0;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,cxxopts::OptionValue>,std::allocator<std::pair<unsigned_long_const,cxxopts::OptionValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<unsigned_long&,cxxopts::OptionValue>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,cxxopts::OptionValue>,std::allocator<std::pair<unsigned_long_const,cxxopts::OptionValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->m_parsed,&local_120,local_c8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._0_8_);
      }
      p_Var18 = p_Var18->_M_nxt;
    } while (p_Var18 != (_Hash_node_base *)0x0);
  }
  pPVar8 = local_50;
  local_48.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseResult::ParseResult
            (local_50,&this->m_keys,&this->m_parsed,&local_48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  return pPVar8;
}

Assistant:

inline ParseResult
OptionParser::parse(int argc, const char* const* argv)
{
  int current = 1;
  bool consume_remaining = false;
  auto next_positional = m_positional.begin();

  std::vector<std::string> unmatched;

  while (current != argc)
  {
    if (strcmp(argv[current], "--") == 0)
    {
      consume_remaining = true;
      ++current;
      break;
    }
    bool matched = false;
    values::parser_tool::ArguDesc argu_desc =
        values::parser_tool::ParseArgument(argv[current], matched);

    if (!matched)
    {
      //not a flag

      // but if it starts with a `-`, then it's an error
      if (argv[current][0] == '-' && argv[current][1] != '\0') {
        if (!m_allow_unrecognised) {
          throw_or_mimic<option_syntax_exception>(argv[current]);
        }
      }

      //if true is returned here then it was consumed, otherwise it is
      //ignored
      if (consume_positional(argv[current], next_positional))
      {
      }
      else
      {
        unmatched.emplace_back(argv[current]);
      }
      //if we return from here then it was parsed successfully, so continue
    }
    else
    {
      //short or long option?
      if (argu_desc.grouping)
      {
        const std::string& s = argu_desc.arg_name;

        for (std::size_t i = 0; i != s.size(); ++i)
        {
          std::string name(1, s[i]);
          auto iter = m_options.find(name);

          if (iter == m_options.end())
          {
            if (m_allow_unrecognised)
            {
              unmatched.push_back(std::string("-") + s[i]);
              continue;
            }
            //error
            throw_or_mimic<option_not_exists_exception>(name);
          }

          auto value = iter->second;

          if (i + 1 == s.size())
          {
            //it must be the last argument
            checked_parse_arg(argc, argv, current, value, name);
          }
          else if (value->value().has_implicit())
          {
            parse_option(value, name, value->value().get_implicit_value());
          }
          else if (i + 1 < s.size())
          {
            std::string arg_value = s.substr(i + 1);
            parse_option(value, name, arg_value);
            break;
          }
          else
          {
            //error
            throw_or_mimic<option_requires_argument_exception>(name);
          }
        }
      }
      else if (argu_desc.arg_name.length() != 0)
      {
        const std::string& name = argu_desc.arg_name;

        auto iter = m_options.find(name);

        if (iter == m_options.end())
        {
          if (m_allow_unrecognised)
          {
            // keep unrecognised options in argument list, skip to next argument
            unmatched.emplace_back(argv[current]);
            ++current;
            continue;
          }
          //error
          throw_or_mimic<option_not_exists_exception>(name);
        }

        auto opt = iter->second;

        //equals provided for long option?
        if (argu_desc.set_value)
        {
          //parse the option given

          parse_option(opt, name, argu_desc.value);
        }
        else
        {
          //parse the next argument
          checked_parse_arg(argc, argv, current, opt, name);
        }
      }

    }

    ++current;
  }

  for (auto& opt : m_options)
  {
    auto& detail = opt.second;
    const auto& value = detail->value();

    auto& store = m_parsed[detail->hash()];

    if (value.has_default()) {
      if (!store.count() && !store.has_default()) {
        parse_default(detail);
      }
    }
    else {
      parse_no_value(detail);
    }
  }

  if (consume_remaining)
  {
    while (current < argc)
    {
      if (!consume_positional(argv[current], next_positional)) {
        break;
      }
      ++current;
    }

    //adjust argv for any that couldn't be swallowed
    while (current != argc) {
      unmatched.emplace_back(argv[current]);
      ++current;
    }
  }

  finalise_aliases();

  ParseResult parsed(std::move(m_keys), std::move(m_parsed), std::move(m_sequential), std::move(unmatched));
  return parsed;
}